

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void __thiscall
Eigen::GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,5>::
scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Scalar *alpha)

{
  Scalar SVar1;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar3;
  BlockingType blocking;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_98;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_50;
  
  local_98.super_level3_blocking<double,_double>.m_mc =
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  pMVar2 = *(Matrix<double,__1,__1,_0,__1,__1> **)this;
  if (local_98.super_level3_blocking<double,_double>.m_mc ==
      (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    local_98.super_level3_blocking<double,_double>.m_nc =
         (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
    pMVar3 = *(Matrix<double,__1,__1,_0,__1,__1> **)(this + 8);
    if (local_98.super_level3_blocking<double,_double>.m_nc ==
        (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)
    {
      if (((local_98.super_level3_blocking<double,_double>.m_nc != 0) &&
          (local_98.super_level3_blocking<double,_double>.m_mc != 0)) &&
         (local_98.super_level3_blocking<double,_double>.m_kc =
               (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols, local_98.super_level3_blocking<double,_double>.m_kc != 0)) {
        SVar1 = *alpha;
        local_98.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
        local_98.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
        local_98.super_level3_blocking<double,_double>.m_blockW = (RhsScalar *)0x0;
        internal::computeProductBlockingSizes<double,double,1,long>
                  (&local_98.super_level3_blocking<double,_double>.m_kc,
                   &local_98.super_level3_blocking<double,_double>.m_mc,
                   &local_98.super_level3_blocking<double,_double>.m_nc);
        local_98.m_sizeA =
             local_98.super_level3_blocking<double,_double>.m_mc *
             local_98.super_level3_blocking<double,_double>.m_kc;
        local_98.m_sizeB =
             local_98.super_level3_blocking<double,_double>.m_nc *
             local_98.super_level3_blocking<double,_double>.m_kc;
        local_98.m_sizeW = local_98.super_level3_blocking<double,_double>.m_kc << 3;
        local_50.m_blocking = &local_98;
        local_50.m_lhs = pMVar2;
        local_50.m_rhs = pMVar3;
        local_50.m_dest = dst;
        local_50.m_actualAlpha = SVar1;
        internal::
        gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
        ::operator()(&local_50,0,*(long *)(*(long *)this + 8),0,
                     *(long *)(*(long *)(this + 8) + 0x10),(GemmParallelInfo<long> *)0x0);
        free(local_98.super_level3_blocking<double,_double>.m_blockA);
        free(local_98.super_level3_blocking<double,_double>.m_blockB);
        free(local_98.super_level3_blocking<double,_double>.m_blockW);
      }
      return;
    }
  }
  __assert_fail("dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chrisgundling[P]Udacity-T2P2-UnscentedKalmanFilter/src/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x193,
                "void Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>::scaleAndAddTo(Dest &, const Scalar &) const [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, ProductType = 5, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

gemm_blocking_space(DenseIndex /*rows*/, DenseIndex /*cols*/, DenseIndex /*depth*/)
    {
      this->m_mc = ActualRows;
      this->m_nc = ActualCols;
      this->m_kc = MaxDepth;
      this->m_blockA = m_staticA;
      this->m_blockB = m_staticB;
      this->m_blockW = m_staticW;
    }